

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O3

void test_insert(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  _Head_base<0UL,_argo::json_*,_false> _Var3;
  json *this;
  ostream *poVar4;
  json o;
  _Head_base<0UL,_argo::json_*,_false> local_f0;
  string local_e8;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [72];
  json local_70;
  
  argo::json::json(&local_70,object_e);
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"one","");
  argo::json::json((json *)local_c8,1);
  argo::json::insert(&local_70,&local_e8,(json *)local_c8);
  argo::json::~json((json *)local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"two","");
  argo::json::json((json *)local_c8,2.123);
  argo::json::insert(&local_70,&local_e8,(json *)local_c8);
  argo::json::~json((json *)local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"three","");
  argo::json::json((json *)local_c8,"asfdsad");
  argo::json::insert(&local_70,&local_e8,(json *)local_c8);
  argo::json::~json((json *)local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  this = (json *)operator_new(0x58);
  argo::json::json(this,1.23);
  puVar2 = (undefined1 *)((long)&((json *)local_c8)->m_value + 8);
  local_e8._M_dataplus._M_p = (pointer)this;
  local_c8[0] = puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"four","");
  local_e8._M_dataplus._M_p = (pointer)0x0;
  local_f0._M_head_impl = this;
  argo::json::insert(&local_70,(string *)local_c8,
                     (unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&local_f0);
  _Var3._M_head_impl = local_f0._M_head_impl;
  if (local_f0._M_head_impl != (json *)0x0) {
    argo::json::~json(local_f0._M_head_impl);
    operator_delete(_Var3._M_head_impl);
  }
  local_f0._M_head_impl = (json *)0x0;
  if (local_c8[0] != puVar2) {
    operator_delete(local_c8[0]);
  }
  poVar4 = argo::operator<<((ostream *)&jlog,&local_70);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  argo::json::~json(&local_70);
  return;
}

Assistant:

void test_insert()
{
    json o(json::object_e);

    o.insert("one", 1);
    o.insert("two", 2.123);
    o.insert("three", "asfdsad");
    unique_ptr<json> x(new json(1.23));
    o.insert("four", move(x));

    jlog << o << endl;
}